

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool testPty(StringRef *cmdLine)

{
  File *this;
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  ulong uVar4;
  size_t __n;
  int __oflag;
  Pty masterPty;
  File slavePty;
  Pipe execPipe;
  File stdinFile;
  Error error;
  winsize winSize;
  
  puts("Opening master PTY...");
  masterPty.super_File.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  slavePty.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)-1;
  execPipe.m_readFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  execPipe.m_writeFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  iVar2 = axl::io::psx::Pty::open(&masterPty,(char *)0x2,__oflag);
  if ((char)iVar2 != '\0') {
    bVar1 = axl::io::psx::Pty::grant(&masterPty);
    if (bVar1) {
      bVar1 = axl::io::psx::Pty::unlock(&masterPty);
      if (bVar1) {
        bVar1 = axl::io::psx::File::setBlockingMode(&masterPty.super_File,false);
        if (bVar1) {
          axl::io::psx::Pty::getSlaveFileName((String *)&winSize,&masterPty);
          __n = 0x1b6;
          iVar2 = axl::io::psx::File::open(&slavePty,(char *)&winSize,0x42);
          if ((char)iVar2 == '\0') {
            axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&winSize);
          }
          else {
            bVar1 = axl::io::psx::Pipe::create(&execPipe);
            axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&winSize);
            if (bVar1) {
              this = &execPipe.m_writeFile;
              iVar2 = 2;
              axl::io::psx::File::fcntl<int>(this,2,1);
              error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.
              super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p =
                   (ErrorHdr *)0x0;
              error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.
              super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_hdr =
                   (BufHdr *)0x0;
              error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.
              super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_size = 0;
              _Var3 = fork();
              if (_Var3 == -1) {
                axl::err::setLastSystemError();
LAB_00112d04:
                bVar1 = false;
              }
              else {
                if (_Var3 == 0) {
                  setsid();
                  axl::io::psx::File::ioctl<int>(&slavePty,0x540e,0);
                  dup2((int)slavePty.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                       0);
                  dup2((int)slavePty.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                       1);
                  iVar2 = 2;
                  dup2((int)slavePty.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                       2);
                  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
                            (&slavePty.
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>,
                             iVar2);
                  exec(cmdLine);
                  axl::err::getLastError();
                  axl::rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::move
                            (&error.
                              super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>
                             ,(ErrorRef *)&winSize);
                  axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
                            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&winSize);
                  axl::io::psx::File::write
                            (this,(int)error.
                                       super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>
                                       .super_ErrorRef.
                                       super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p,
                             (void *)(ulong)(error.
                                             super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>
                                             .super_ErrorRef.
                                             super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>
                                            .m_p)->m_size,__n);
                  axl::io::psx::File::flush(this);
                  _exit(-1);
                }
                axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
                          (&this->
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>,
                           iVar2);
                axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
                          (&slavePty.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>,
                           iVar2);
                iVar2 = (int)&winSize;
                uVar4 = axl::io::psx::File::read(&execPipe.m_readFile,iVar2,(void *)0x100,__n);
                if (1 < uVar4 + 1) {
                  if (uVar4 == (uint)winSize._0_4_) {
                    axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::BufRef
                              ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&stdinFile,
                               (ErrorHdr *)&winSize);
                    axl::err::setError((ErrorRef *)&stdinFile);
                  }
                  else {
                    axl::err::ErrorRef::ErrorRef((ErrorRef *)&stdinFile,"POSIX execvpe failed");
                    axl::err::setError((ErrorRef *)&stdinFile);
                  }
                  axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
                            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&stdinFile);
                  goto LAB_00112d04;
                }
                stdinFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
                     (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)-1;
                axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
                          (&stdinFile.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>,
                           iVar2);
                stdinFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
                     (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0;
                axl::io::psx::File::setBlockingMode(&stdinFile,false);
                winSize.ws_row = 0x28;
                winSize.ws_col = 0x5a;
                axl::io::psx::File::ioctl<winsize*>(&masterPty.super_File,0x5414,&winSize);
                pumpChildStdio((int)masterPty.super_File.
                                    super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                    .m_h,
                               (int)masterPty.super_File.
                                    super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                    .m_h,-1);
                axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
                          (&stdinFile.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>);
                bVar1 = true;
              }
              axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
                        ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&error);
              goto LAB_00112c86;
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_00112c86:
  axl::io::psx::Pipe::~Pipe(&execPipe);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            (&slavePty.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&masterPty);
  return bVar1;
}

Assistant:

bool
testPty(const sl::StringRef& cmdLine) {
	printf("Opening master PTY...\n");

	axl::io::psx::Pty masterPty;
	axl::io::psx::File slavePty;
	axl::io::psx::Pipe execPipe;

	bool result =
		masterPty.open() &&
		masterPty.grant() &&
		masterPty.unlock() &&
		masterPty.setBlockingMode(false) &&
		slavePty.open(masterPty.getSlaveFileName()) &&
		execPipe.create();

	if (!result)
		return false;

	execPipe.m_writeFile.fcntl(F_SETFD, FD_CLOEXEC);
	err::Error error;

	pid_t pid = ::fork();
	switch (pid) {
	case -1:
		err::setLastSystemError();
		return false;

	case 0:
		::setsid();

		slavePty.ioctl(TIOCSCTTY, (int)0);

		::dup2(slavePty, STDIN_FILENO);
		::dup2(slavePty, STDOUT_FILENO);
		::dup2(slavePty, STDERR_FILENO);

		slavePty.close();

		exec(cmdLine);

		error = err::getLastError();
		execPipe.m_writeFile.write(error, error->m_size);
		execPipe.m_writeFile.flush();

		::_exit(-1);
		ASSERT(false);

	default:
		execPipe.m_writeFile.close();
		slavePty.close();

		fd_set rdset;
		FD_ZERO(&rdset);
		FD_SET(execPipe.m_readFile, &rdset);

		char buffer[256];
		size_t size = execPipe.m_readFile.read(buffer, sizeof(buffer));
		if (size == 0 || size == -1)
			break;

		if (((err::ErrorHdr*)buffer)->m_size == size)
			err::setError((err::ErrorHdr*)buffer);
		else
			err::setError("POSIX execvpe failed"); // unlikely fallback

		return false;
	}

	axl::io::psx::File stdinFile;
	stdinFile.attach(STDIN_FILENO);
	stdinFile.setBlockingMode(false);

	struct winsize winSize;
	winSize.ws_col = 90;
	winSize.ws_row = 40;
	masterPty.ioctl(TIOCSWINSZ, &winSize);

	pumpChildStdio(masterPty, masterPty, -1);
	return true;
}